

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void Convert16To8Row_C(uint16_t *src_y,uint8_t *dst_y,int scale,int width)

{
  int32_t iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int x;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    iVar1 = libyuv::clamp255((int)((uint)*(ushort *)(in_RDI + (long)local_1c * 2) * in_EDX) >> 0x10)
    ;
    *(char *)(in_RSI + local_1c) = (char)iVar1;
  }
  return;
}

Assistant:

void Convert16To8Row_C(const uint16_t* src_y,
                       uint8_t* dst_y,
                       int scale,
                       int width) {
  int x;
  for (x = 0; x < width; ++x) {
    dst_y[x] = clamp255((src_y[x] * scale) >> 16);
  }
}